

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O3

void __thiscall prevector_tests::PrevectorTestInt::test_method(PrevectorTestInt *this)

{
  Size s;
  size_type new_capacity;
  realtype values_00;
  void *pvVar1;
  pointer piVar2;
  int iVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  EVP_PKEY_CTX *src;
  FastRandomContext *rng;
  EVP_PKEY_CTX *dst;
  uint uVar12;
  int *v;
  pointer piVar13;
  int iVar14;
  int iVar15;
  long in_FS_OFFSET;
  int values [4];
  prevector_tester<8U,_int> test;
  undefined8 in_stack_fffffffffffffed8;
  pointer in_stack_fffffffffffffee8;
  pointer local_108;
  allocator_type local_f9;
  vector<int,_std::allocator<int>_> local_f8;
  prevector_tester<8U,_int> local_e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rng = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.super_BasicTestingSetup.
         m_rng;
  uVar4 = 0;
  do {
    prevector_tester<8U,_int>::prevector_tester(&local_e0,rng);
    iVar15 = 0;
    do {
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,2)
      ;
      if (uVar5 == 0) {
        uVar6 = (ulong)((long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar12 = (uint)uVar6;
        if (uVar12 == 0) {
          uVar9 = 0x20;
        }
        else {
          uVar9 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar9 = uVar9 ^ 0x1f;
        }
        do {
          uVar5 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar9);
        } while ((uVar6 & 0xffffffff) < uVar5);
        uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (undefined4)uVar7;
        prevector_tester<8U,_int>::insert(&local_e0,(Size)uVar5,(int *)&local_f8);
      }
      if (((long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
        uVar5 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,2);
        if (uVar5 == 1) {
          uVar12 = (int)((ulong)((long)local_e0.real_vector.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)local_e0.real_vector.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2) - 1;
          if (uVar12 == 0) {
            uVar9 = 0x20;
          }
          else {
            uVar9 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> uVar9 == 0; uVar9 = uVar9 - 1) {
              }
            }
            uVar9 = uVar9 ^ 0x1f;
          }
          do {
            uVar5 = RandomMixin<FastRandomContext>::randbits
                              (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar9);
          } while (uVar12 < uVar5);
          prevector_tester<8U,_int>::erase(&local_e0,(Size)uVar5);
        }
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar5 == 2) {
        uVar6 = (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        do {
          uVar5 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,3);
        } while (4 < uVar5);
        iVar3 = (int)uVar5 + (int)(uVar6 >> 2);
        iVar14 = 2;
        if (2 < iVar3) {
          iVar14 = iVar3;
        }
        s = iVar14 - 2;
        if (0x1f < iVar3) {
          s = 0x1e;
        }
        prevector_tester<8U,_int>::resize(&local_e0,s);
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar5 == 3) {
        uVar6 = (ulong)((long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar12 = (uint)uVar6;
        if (uVar12 == 0) {
          uVar9 = 0x20;
        }
        else {
          uVar9 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar9 = uVar9 ^ 0x1f;
        }
        do {
          uVar5 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar9);
        } while ((uVar6 & 0xffffffff) < uVar5);
        uVar7 = RandomMixin<FastRandomContext>::randbits<1>
                          (&rng->super_RandomMixin<FastRandomContext>);
        uVar8 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (undefined4)uVar8;
        prevector_tester<8U,_int>::insert(&local_e0,(Size)uVar5,2 - (uVar7 == 0),(int *)&local_f8);
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar5 == 4) {
        uVar6 = (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        uVar5 = RandomMixin<FastRandomContext>::randbits<1>
                          (&rng->super_RandomMixin<FastRandomContext>);
        iVar14 = 2 - (uint)(uVar5 == 0);
        iVar3 = (int)(uVar6 >> 2);
        if (iVar3 <= iVar14) {
          iVar14 = iVar3;
        }
        uVar12 = (int)((ulong)((long)local_e0.real_vector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)local_e0.real_vector.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2) - iVar14;
        if (uVar12 == 0) {
          uVar9 = 0x20;
        }
        else {
          uVar9 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar9 = uVar9 ^ 0x1f;
        }
        do {
          uVar5 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar9);
        } while (uVar12 < uVar5);
        prevector_tester<8U,_int>::erase(&local_e0,(Size)uVar5,iVar14 + (Size)uVar5);
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,4)
      ;
      if (uVar5 == 5) {
        uVar5 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (undefined4)uVar5;
        prevector_tester<8U,_int>::push_back(&local_e0,(int *)&local_f8);
      }
      if (((long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
        uVar5 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,4);
        if (uVar5 == 6) {
          prevector_tester<8U,_int>::pop_back(&local_e0);
        }
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar5 == 7) {
        uVar5 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,2);
        uVar12 = (uint)uVar5 + 1;
        if ((uint)uVar5 < 0x7fffffff) {
          uVar6 = 0;
          do {
            uVar5 = RandomMixin<FastRandomContext>::randbits<32>
                              (&rng->super_RandomMixin<FastRandomContext>);
            *(int *)((long)&local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar6 * 4) = (int)uVar5;
            uVar6 = uVar6 + 1;
          } while (uVar12 != uVar6);
        }
        uVar6 = (ulong)((long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar9 = (uint)uVar6;
        if (uVar9 == 0) {
          uVar10 = 0x20;
        }
        else {
          uVar10 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar10 == 0; uVar10 = uVar10 - 1) {
            }
          }
          uVar10 = uVar10 ^ 0x1f;
        }
        do {
          uVar5 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar10);
        } while ((uVar6 & 0xffffffff) < uVar5);
        prevector_tester<8u,int>::insert_range<int*>
                  ((prevector_tester<8u,int> *)&local_e0,(Size)uVar5,(int *)&local_f8,
                   (int *)((long)&local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + (long)(int)uVar12 * 4));
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar5 == 8) {
        uVar6 = (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        uVar5 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,2);
        iVar14 = (int)uVar5 + 1;
        iVar3 = (int)(uVar6 >> 2);
        if (iVar3 <= iVar14) {
          iVar14 = iVar3;
        }
        uVar12 = (int)((ulong)((long)local_e0.real_vector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)local_e0.real_vector.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2) - iVar14;
        if (uVar12 == 0) {
          uVar9 = 0x20;
        }
        else {
          uVar9 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar9 = uVar9 ^ 0x1f;
        }
        do {
          uVar5 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar9);
        } while (uVar12 < uVar5);
        prevector_tester<8U,_int>::erase(&local_e0,(Size)uVar5,iVar14 + (Size)uVar5);
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar5 == 9) {
        uVar5 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,5);
        prevector_tester<8U,_int>::reserve(&local_e0,(Size)uVar5);
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,6)
      ;
      if (uVar5 == 10) {
        new_capacity = local_e0.pre_vector._size - 9;
        if (local_e0.pre_vector._size < 9) {
          new_capacity = local_e0.pre_vector._size;
        }
        prevector<8U,_int,_unsigned_int,_int>::change_capacity(&local_e0.pre_vector,new_capacity);
        prevector_tester<8U,_int>::test(&local_e0);
      }
      iVar14 = (int)((ulong)((long)local_e0.real_vector.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2);
      if (iVar14 != 0) {
        uVar12 = iVar14 - 1;
        if (uVar12 == 0) {
          uVar9 = 0x20;
        }
        else {
          uVar9 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar9 = uVar9 ^ 0x1f;
        }
        do {
          uVar5 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar9);
        } while (uVar12 < uVar5);
        uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5 & 0xffffffff] = (int)uVar7;
        uVar11 = &local_e0.pre_vector;
        if (8 < local_e0.pre_vector._size) {
          uVar11 = local_e0.pre_vector._union.indirect_contents.indirect;
        }
        *(int *)((long)&((pretype *)uVar11)->_union + (long)(int)uVar5 * 4) = (int)uVar7;
        prevector_tester<8U,_int>::test(&local_e0);
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits
                        (&rng->super_RandomMixin<FastRandomContext>,10);
      if (uVar5 == 0xb) {
        if (local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        prevector<8U,_int,_unsigned_int,_int>::resize(&local_e0.pre_vector,0);
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,9)
      ;
      if (uVar5 == 0xc) {
        uVar5 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,5);
        uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (undefined4)uVar7;
        std::vector<int,_std::allocator<int>_>::_M_fill_assign
                  (&local_e0.real_vector,uVar5 & 0xffffffff,(value_type_conflict2 *)&local_f8);
        prevector<8U,_int,_unsigned_int,_int>::assign
                  (&local_e0.pre_vector,(size_type)uVar5,(int *)&local_f8);
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar5 == 3) {
        prevector_tester<8U,_int>::swap(&local_e0);
      }
      dst = (EVP_PKEY_CTX *)0x4;
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,4)
      ;
      if (uVar5 == 8) {
        prevector_tester<8U,_int>::copy(&local_e0,dst,src);
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar5 == 0x12) {
        prevector_tester<8U,_int>::move(&local_e0);
      }
      uVar5 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar5 == 0x13) {
        uVar5 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,4);
        std::vector<int,_std::allocator<int>_>::vector(&local_f8,(ulong)((int)uVar5 + 1),&local_f9);
        piVar2 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar13 = (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_);
            piVar13 != piVar2; piVar13 = piVar13 + 1) {
          uVar5 = RandomMixin<FastRandomContext>::randbits<32>
                            (&rng->super_RandomMixin<FastRandomContext>);
          *piVar13 = (int)uVar5;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffee8,&local_f8);
        values_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)uVar4;
        values_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)in_stack_fffffffffffffed8;
        values_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = in_stack_fffffffffffffee8;
        prevector_tester<8U,_int>::resize_uninitialized(&local_e0,values_00);
        if (in_stack_fffffffffffffee8 != (pointer)0x0) {
          operator_delete(in_stack_fffffffffffffee8,
                          (long)local_108 - (long)in_stack_fffffffffffffee8);
        }
        pvVar1 = (void *)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,(long)local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar1);
        }
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != 0x800);
    prevector_tester<8U,_int>::~prevector_tester(&local_e0);
    uVar12 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar12;
  } while (uVar12 != 0x40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(PrevectorTestInt)
{
    for (int j = 0; j < 64; j++) {
        prevector_tester<8, int> test{m_rng};
        for (int i = 0; i < 2048; i++) {
            if (m_rng.randbits(2) == 0) {
                test.insert(m_rng.randrange(test.size() + 1), int(m_rng.rand32()));
            }
            if (test.size() > 0 && m_rng.randbits(2) == 1) {
                test.erase(m_rng.randrange(test.size()));
            }
            if (m_rng.randbits(3) == 2) {
                int new_size = std::max(0, std::min(30, (int)test.size() + (int)m_rng.randrange(5) - 2));
                test.resize(new_size);
            }
            if (m_rng.randbits(3) == 3) {
                test.insert(m_rng.randrange(test.size() + 1), 1 + m_rng.randbool(), int(m_rng.rand32()));
            }
            if (m_rng.randbits(3) == 4) {
                int del = std::min<int>(test.size(), 1 + (m_rng.randbool()));
                int beg = m_rng.randrange(test.size() + 1 - del);
                test.erase(beg, beg + del);
            }
            if (m_rng.randbits(4) == 5) {
                test.push_back(int(m_rng.rand32()));
            }
            if (test.size() > 0 && m_rng.randbits(4) == 6) {
                test.pop_back();
            }
            if (m_rng.randbits(5) == 7) {
                int values[4];
                int num = 1 + (m_rng.randbits(2));
                for (int k = 0; k < num; k++) {
                    values[k] = int(m_rng.rand32());
                }
                test.insert_range(m_rng.randrange(test.size() + 1), values, values + num);
            }
            if (m_rng.randbits(5) == 8) {
                int del = std::min<int>(test.size(), 1 + (m_rng.randbits(2)));
                int beg = m_rng.randrange(test.size() + 1 - del);
                test.erase(beg, beg + del);
            }
            if (m_rng.randbits(5) == 9) {
                test.reserve(m_rng.randbits(5));
            }
            if (m_rng.randbits(6) == 10) {
                test.shrink_to_fit();
            }
            if (test.size() > 0) {
                test.update(m_rng.randrange(test.size()), int(m_rng.rand32()));
            }
            if (m_rng.randbits(10) == 11) {
                test.clear();
            }
            if (m_rng.randbits(9) == 12) {
                test.assign(m_rng.randbits(5), int(m_rng.rand32()));
            }
            if (m_rng.randbits(3) == 3) {
                test.swap();
            }
            if (m_rng.randbits(4) == 8) {
                test.copy();
            }
            if (m_rng.randbits(5) == 18) {
                test.move();
            }
            if (m_rng.randbits(5) == 19) {
                unsigned int num = 1 + (m_rng.randbits(4));
                std::vector<int> values(num);
                for (int& v : values) {
                    v = int(m_rng.rand32());
                }
                test.resize_uninitialized(values);
            }
        }
    }
}